

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsVcTotalLevel(uint arg_count,long *arg_array)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *local_c8;
  uint *local_c0;
  uint *local_b8;
  uint *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  if (arg_count < 4) {
    __assert_fail("arg_count >= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x549,"void Macro_smpsVcTotalLevel(unsigned int, long *)");
  }
  vcTL1 = (uint)*arg_array;
  vcTL2 = *(uint *)(arg_array + 1);
  vcTL3 = *(uint *)(arg_array + 2);
  vcTL4 = *(uint *)(arg_array + 3);
  WriteByte((char)(vcUnusedBits << 6) + (char)vcFeedback * '\b' + (char)vcAlgorithm);
  vcTLMask4 = 0;
  vcTLMask3 = 0;
  vcTLMask2 = 0;
  if (target_smps2asm_version == 0) {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
  }
  vcTLMask1 = target_smps2asm_version == 0;
  if (source_driver < 3 && 2 < target_driver) {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTL1 = vcTL1 & 0x7f;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
    vcTL2 = vcTL2 & 0x7f;
    vcTL3 = vcTL3 & 0x7f;
    vcTLMask1 = '\x01';
    vcTL4 = vcTL4 & 0x7f;
  }
  else {
    if (2 < source_driver && target_driver < 3) {
      if ((vcTL1 & 0x80) == 0) {
        if ((((byte)vcTL2 >> 7 & 4 < vcAlgorithm) == 0) &&
           (((byte)vcTL3 >> 7 & 3 < vcAlgorithm) == 0)) {
          if ((vcAlgorithm == 7 & (byte)vcTL4 >> 7) != 1) goto LAB_0010534e;
        }
      }
      printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n"
             ,(ulong)current_voice);
    }
LAB_0010534e:
    if (target_driver == 2) {
      local_38 = &vcTLMask3;
      local_40 = &vcTL3;
      local_48 = &vcTLMask2;
      local_50 = &vcTL2;
      local_58 = &vcRR3;
      local_60 = &vcDL3;
      local_68 = &vcRR2;
      local_70 = &vcDL2;
      local_78 = &vcD2R3;
      local_80 = &vcD2R2;
      local_88 = &vcD1R3Unk;
      local_90 = &vcD1R3;
      local_98 = &vcAM3;
      local_a0 = &vcD1R2Unk;
      local_a8 = &vcD1R2;
      local_b0 = &vcAM2;
      local_b8 = &vcAR3;
      local_c0 = &vcRS3;
      local_c8 = &vcAR2;
      puVar5 = &vcRS2;
      puVar3 = &vcCF3;
      puVar2 = &vcDT3;
      puVar1 = &vcCF2;
      puVar4 = &vcDT2;
      goto LAB_0010557a;
    }
  }
  local_38 = &vcTLMask2;
  local_40 = &vcTL2;
  local_48 = &vcTLMask3;
  local_50 = &vcTL3;
  local_58 = &vcRR2;
  local_60 = &vcDL2;
  local_68 = &vcRR3;
  local_70 = &vcDL3;
  local_78 = &vcD2R2;
  local_80 = &vcD2R3;
  local_88 = &vcD1R2Unk;
  local_90 = &vcD1R2;
  local_98 = &vcAM2;
  local_a0 = &vcD1R3Unk;
  local_a8 = &vcD1R3;
  local_b0 = &vcAM3;
  local_b8 = &vcAR2;
  local_c0 = &vcRS2;
  local_c8 = &vcAR3;
  puVar5 = &vcRS3;
  puVar3 = &vcCF2;
  puVar2 = &vcDT2;
  puVar1 = &vcCF3;
  puVar4 = &vcDT3;
LAB_0010557a:
  WriteByte((char)(vcDT4 << 4) + (char)vcCF4);
  WriteByte((char)(*puVar4 << 4) + (char)*puVar1);
  WriteByte((char)(*puVar2 << 4) + (char)*puVar3);
  WriteByte((char)(vcDT1 << 4) + (char)vcCF1);
  WriteByte((char)(vcRS4 << 6) + (char)vcAR4);
  WriteByte((char)(*puVar5 << 6) + (char)*local_c8);
  WriteByte((char)(*local_c0 << 6) + (char)*local_b8);
  WriteByte((char)(vcRS1 << 6) + (char)vcAR1);
  WriteByte((byte)vcD1R4Unk | (byte)vcD1R4 | (byte)vcAM4);
  WriteByte((byte)*local_a0 | (byte)*local_a8 | (byte)*local_b0);
  WriteByte((byte)*local_88 | (byte)*local_90 | (byte)*local_98);
  WriteByte((byte)vcD1R1Unk | (byte)vcD1R1 | (byte)vcAM1);
  WriteByte((uchar)vcD2R4);
  WriteByte((uchar)*local_80);
  WriteByte((uchar)*local_78);
  WriteByte((uchar)vcD2R1);
  WriteByte((char)(vcDL4 << 4) + (char)vcRR4);
  WriteByte((char)(*local_70 << 4) + (char)*local_68);
  WriteByte((char)(*local_60 << 4) + (char)*local_58);
  WriteByte((char)(vcDL1 << 4) + (char)vcRR1);
  WriteByte((byte)vcTLMask4 | (byte)vcTL4);
  WriteByte((byte)*local_48 | (byte)*local_50);
  WriteByte((byte)*local_38 | (byte)*local_40);
  WriteByte(vcTLMask1 << 7 | (byte)vcTL1);
  current_voice = current_voice + 1;
  return;
}

Assistant:

static void Macro_smpsVcTotalLevel(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	vcTL1 = arg_array[0];
	vcTL2 = arg_array[1];
	vcTL3 = arg_array[2];
	vcTL4 = arg_array[3];

	WriteByte((vcUnusedBits << 6) + (vcFeedback << 3) + vcAlgorithm);

	if (target_smps2asm_version == 0)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;
	}
	else
	{
		vcTLMask4 = 0;
		vcTLMask3 = 0;
		vcTLMask2 = 0;
		vcTLMask1 = 0;
	}

	if (target_driver >= 3 && source_driver < 3)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;

		vcTL1 &= 0x7F;
		vcTL2 &= 0x7F;
		vcTL3 &= 0x7F;
		vcTL4 &= 0x7F;
	}
	else if (target_driver < 3 && source_driver >= 3 && ((vcTL1 & 0x80) || (vcTL2 & 0x80 && vcAlgorithm >= 5) || (vcTL3 & 0x80 && vcAlgorithm >= 4) || (vcTL4 & 0x80 && vcAlgorithm == 7)))
	{
		printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n", current_voice);
	}

	if (target_driver == 2)
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R2);
		WriteByte(vcD2R3);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL1|vcTLMask1);
	}
	else
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R3);
		WriteByte(vcD2R2);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL1|vcTLMask1);
	}

	++current_voice;
}